

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdHist.c
# Opt level: O0

void Cmd_HistoryAddCommand(Abc_Frame_t *p,char *command)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  size_t sVar2;
  char *Entry;
  int local_803c;
  int Start;
  int i;
  char *pStr;
  char local_8028 [4];
  int Len;
  char Buffer [32768];
  int nLastSaved;
  int nLastLooked;
  char *command_local;
  Abc_Frame_t *p_local;
  
  if (p->fBatchMode == 0) {
    sVar2 = strlen(command);
    pStr._4_4_ = (int)sVar2;
    strcpy(local_8028,command);
    if (local_8028[pStr._4_4_ + -1] == '\n') {
      local_8028[pStr._4_4_ + -1] = '\0';
    }
    sVar2 = strlen(local_8028);
    if ((((((3 < sVar2) && (iVar1 = strncmp(local_8028,"set",3), iVar1 != 0)) &&
          (iVar1 = strncmp(local_8028,"unset",5), iVar1 != 0)) &&
         ((iVar1 = strncmp(local_8028,"time",4), iVar1 != 0 &&
          (iVar1 = strncmp(local_8028,"quit",4), iVar1 != 0)))) &&
        ((iVar1 = strncmp(local_8028,"alias",5), iVar1 != 0 &&
         ((iVar1 = strncmp(local_8028,"history",7), iVar1 != 0 &&
          (iVar1 = strncmp(local_8028,"hi ",3), iVar1 != 0)))))) &&
       ((iVar1 = strcmp(local_8028,"hi"), iVar1 != 0 &&
        (sVar2 = strlen(local_8028), local_8028[sVar2 - 1] != '?')))) {
      _Start = (char *)0x0;
      iVar1 = Vec_PtrSize(p->aHistory);
      for (local_803c = Abc_MaxInt(0,iVar1 + -10); iVar1 = Vec_PtrSize(p->aHistory),
          local_803c < iVar1; local_803c = local_803c + 1) {
        _Start = (char *)Vec_PtrEntry(p->aHistory,local_803c);
        iVar1 = strcmp(_Start,local_8028);
        if (iVar1 == 0) break;
      }
      iVar1 = Vec_PtrSize(p->aHistory);
      if (local_803c == iVar1) {
        p_00 = p->aHistory;
        Entry = Extra_UtilStrsav(local_8028);
        Vec_PtrPush(p_00,Entry);
        Cmd_HistoryWrite(p,1000);
      }
      else {
        Vec_PtrRemove(p->aHistory,_Start);
        Vec_PtrPush(p->aHistory,_Start);
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cmd_HistoryAddCommand(	Abc_Frame_t * p, const char * command )
{
    int nLastLooked =   10;  // do not add history if the same entry appears among the last entries
    int nLastSaved  = 1000;  // when saving a file, save no more than this number of last entries
    char Buffer[ABC_MAX_STR];
    int Len;
    if ( p->fBatchMode )
        return;
    Len = strlen(command);
    strcpy( Buffer, command );
    if ( Buffer[Len-1] == '\n' )
        Buffer[Len-1] = 0;
    if ( strlen(Buffer) > 3 &&
         strncmp(Buffer,"set",3) && 
         strncmp(Buffer,"unset",5) && 
         strncmp(Buffer,"time",4) && 
         strncmp(Buffer,"quit",4) && 
         strncmp(Buffer,"alias",5) && 
//         strncmp(Buffer,"source",6) && 
         strncmp(Buffer,"history",7) && strncmp(Buffer,"hi ", 3) && strcmp(Buffer,"hi") &&
         Buffer[strlen(Buffer)-1] != '?' )
    {
        char * pStr = NULL;
        int i, Start = Abc_MaxInt( 0, Vec_PtrSize(p->aHistory) - nLastLooked );
        // do not enter if the same command appears among nLastLooked commands
        Vec_PtrForEachEntryStart( char *, p->aHistory, pStr, i, Start )
            if ( !strcmp(pStr, Buffer) )
                break;
        if ( i == Vec_PtrSize(p->aHistory) )
        { // add new entry
            Vec_PtrPush( p->aHistory, Extra_UtilStrsav(Buffer) );
            Cmd_HistoryWrite( p, nLastSaved );
        }
        else
        { // put at the end
            Vec_PtrRemove( p->aHistory, pStr );
            Vec_PtrPush( p->aHistory, pStr );
        }
    }
}